

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateInterface
          (ImmutableMessageGenerator *this,Printer *printer)

{
  _Rb_tree_header *p_Var1;
  int *piVar2;
  Context *context;
  java *this_00;
  long lVar3;
  long lVar4;
  __uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
  _Var5;
  LogMessage *other;
  long *plVar6;
  OneofGeneratorInfo *pOVar7;
  ClassNameResolver *this_01;
  _Base_ptr p_Var8;
  Descriptor *extraout_RDX;
  Descriptor *extraout_RDX_00;
  Descriptor *pDVar9;
  long lVar10;
  long lVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  int *local_78 [2];
  int local_68 [10];
  ImmutableMessageGenerator *local_40;
  char *local_38;
  
  pDVar9 = (this->super_MessageGenerator).descriptor_;
  context = this->context_;
  piVar2 = &((LogMessage *)local_78)->line_;
  local_78[0] = piVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"OrBuilder","");
  MaybePrintGeneratedAnnotation<google::protobuf::Descriptor_const>
            (context,printer,pDVar9,true,(string *)local_78);
  pDVar9 = extraout_RDX;
  if (local_78[0] != piVar2) {
    operator_delete(local_78[0]);
    pDVar9 = extraout_RDX_00;
  }
  this_00 = (java *)(this->super_MessageGenerator).descriptor_;
  local_98._M_dataplus._M_p = "@java.lang.Deprecated ";
  if (*(int *)(this_00 + 0x78) < 1) {
    if (*(char *)(*(long *)(this_00 + 0x20) + 0x4a) == '\0') {
      local_98._M_dataplus._M_p = "";
    }
    ExtraMessageOrBuilderInterfaces_abi_cxx11_((string *)local_78,this_00,pDVar9);
    io::Printer::
    Print<char[12],char_const*,char[17],std::__cxx11::string,char[10],std::__cxx11::string,char[2],char[1],char[2],char[1]>
              (printer,
               "$deprecation$public interface ${$$classname$OrBuilder$}$ extends\n    $extra_interfaces$\n    com.google.protobuf.MessageOrBuilder {\n"
               ,(char (*) [12])0x4244ff,(char **)&local_98,(char (*) [17])"extra_interfaces",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
               (char (*) [10])0x3f42d2,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                ((this->super_MessageGenerator).descriptor_ + 8),(char (*) [2])0x43fc20,
               (char (*) [1])0x3e25d9,(char (*) [2])0x42b4a2,(char (*) [1])0x3e25d9);
    if (local_78[0] != piVar2) {
      operator_delete(local_78[0]);
    }
  }
  else {
    if (*(char *)(*(long *)(this_00 + 0x20) + 0x4a) == '\0') {
      local_98._M_dataplus._M_p = "";
    }
    local_38 = local_98._M_dataplus._M_p;
    ExtraMessageOrBuilderInterfaces_abi_cxx11_((string *)local_78,this_00,pDVar9);
    local_98.field_2._M_allocated_capacity._0_2_ = 0x3356;
    local_98._M_string_length = 2;
    local_98.field_2._M_local_buf[2] = '\0';
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    io::Printer::
    Print<char[12],char_const*,char[17],std::__cxx11::string,char[10],std::__cxx11::string,char[2],char[1],char[2],char[1],char[4],std::__cxx11::string>
              (printer,
               "$deprecation$public interface ${$$classname$OrBuilder$}$ extends\n    $extra_interfaces$\n    com.google.protobuf.GeneratedMessage$ver$.\n        ExtendableMessageOrBuilder<$classname$> {\n"
               ,(char (*) [12])0x4244ff,&local_38,(char (*) [17])"extra_interfaces",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
               (char (*) [10])0x3f42d2,
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                ((this->super_MessageGenerator).descriptor_ + 8),(char (*) [2])0x43fc20,
               (char (*) [1])0x3e25d9,(char (*) [2])0x42b4a2,(char (*) [1])0x3e25d9,
               (char (*) [4])0x3e4f76,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if (local_78[0] != &((LogMessage *)local_78)->line_) {
      operator_delete(local_78[0]);
    }
  }
  io::Printer::Annotate<google::protobuf::Descriptor>
            (printer,"{","}",(this->super_MessageGenerator).descriptor_);
  io::Printer::Indent(printer);
  if (0 < *(int *)((this->super_MessageGenerator).descriptor_ + 4)) {
    lVar10 = 0;
    lVar11 = 0;
    local_40 = this;
    do {
      io::Printer::Print<>(printer,"\n");
      lVar3 = *(long *)((this->super_MessageGenerator).descriptor_ + 0x28);
      if (*(Descriptor **)(lVar3 + 0x20 + lVar10) != (this->field_generators_).descriptor_) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_78,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.h"
                   ,0x8a);
        other = internal::LogMessage::operator<<
                          ((LogMessage *)local_78,
                           "CHECK failed: (field->containing_type()) == (descriptor_): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_98,other);
        internal::LogMessage::~LogMessage((LogMessage *)local_78);
        this = local_40;
      }
      if ((*(byte *)(lVar3 + 1 + lVar10) & 8) == 0) {
        plVar6 = (long *)(*(long *)(lVar3 + 0x20 + lVar10) + 0x28);
      }
      else {
        lVar4 = *(long *)(lVar3 + 0x28 + lVar10);
        if (lVar4 == 0) {
          plVar6 = (long *)(*(long *)(lVar3 + 0x10 + lVar10) + 0x70);
        }
        else {
          plVar6 = (long *)(lVar4 + 0x50);
        }
      }
      _Var5._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>.
      _M_head_impl = (this->field_generators_).field_generators_.
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [(int)((ulong)((lVar3 - *plVar6) + lVar10) >> 3) * 0x38e38e39]._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                     ._M_t;
      (**(code **)(*(long *)_Var5._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                            .
                            super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                            ._M_head_impl + 0x20))
                (_Var5._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                 ._M_head_impl,printer);
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 0x48;
    } while (lVar11 < *(int *)((this->super_MessageGenerator).descriptor_ + 4));
  }
  p_Var8 = (this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header._M_header.
           _M_left;
  p_Var1 = &(this->super_MessageGenerator).oneofs_._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var8 != p_Var1) {
    do {
      pOVar7 = Context::GetOneofGeneratorInfo(this->context_,*(OneofDescriptor **)(p_Var8 + 1));
      this_01 = Context::GetNameResolver(this->context_);
      ClassNameResolver::GetClassName_abi_cxx11_
                (&local_98,this_01,(this->super_MessageGenerator).descriptor_,true);
      io::Printer::Print<char[23],std::__cxx11::string,char[10],std::__cxx11::string>
                (printer,
                 "\npublic $classname$.$oneof_capitalized_name$Case get$oneof_capitalized_name$Case();\n"
                 ,(char (*) [23])"oneof_capitalized_name",&pOVar7->capitalized_name,
                 (char (*) [10])0x3f42d2,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p);
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var1);
  }
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateInterface(io::Printer* printer) {
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_,
                                /* immutable = */ true, "OrBuilder");
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        "$deprecation$public interface ${$$classname$OrBuilder$}$ extends\n"
        "    $extra_interfaces$\n"
        "    com.google.protobuf.GeneratedMessage$ver$.\n"
        "        ExtendableMessageOrBuilder<$classname$> {\n",
        "deprecation",
        descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "",
        "extra_interfaces", ExtraMessageOrBuilderInterfaces(descriptor_),
        "classname", descriptor_->name(), "{", "", "}", "", "ver",
        GeneratedCodeVersionSuffix());
  } else {
    printer->Print(
        "$deprecation$public interface ${$$classname$OrBuilder$}$ extends\n"
        "    $extra_interfaces$\n"
        "    com.google.protobuf.MessageOrBuilder {\n",
        "deprecation",
        descriptor_->options().deprecated() ? "@java.lang.Deprecated " : "",
        "extra_interfaces", ExtraMessageOrBuilderInterfaces(descriptor_),
        "classname", descriptor_->name(), "{", "", "}", "");
  }
  printer->Annotate("{", "}", descriptor_);

  printer->Indent();
  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("\n");
    field_generators_.get(descriptor_->field(i))
        .GenerateInterfaceMembers(printer);
  }
  for (auto oneof : oneofs_) {
    printer->Print(
        "\n"
        "public $classname$.$oneof_capitalized_name$Case "
        "get$oneof_capitalized_name$Case();\n",
        "oneof_capitalized_name",
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name, "classname",
        context_->GetNameResolver()->GetImmutableClassName(descriptor_));
  }
  printer->Outdent();

  printer->Print("}\n");
}